

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Vec_StrSelectSortCost2(char **pArray,int nSize,Vec_Int_t *vCounts,Vec_Int_t *vPerm)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int t_1;
  char *t;
  int *pPerm;
  int local_30;
  int best_i;
  int j;
  int i;
  Vec_Int_t *vPerm_local;
  Vec_Int_t *vCounts_local;
  int nSize_local;
  char **pArray_local;
  
  Vec_IntClear(vPerm);
  for (best_i = 0; best_i < nSize; best_i = best_i + 1) {
    Vec_IntPush(vPerm,best_i);
  }
  piVar4 = Vec_IntArray(vPerm);
  best_i = 0;
  do {
    if (nSize + -1 <= best_i) {
      return;
    }
    pPerm._4_4_ = best_i;
    local_30 = best_i;
LAB_00ace87a:
    local_30 = local_30 + 1;
    if (local_30 < nSize) {
      iVar2 = Vec_IntEntry(vCounts,piVar4[local_30]);
      iVar3 = Vec_IntEntry(vCounts,piVar4[pPerm._4_4_]);
      if (iVar3 <= iVar2) break;
      goto LAB_00ace910;
    }
    pcVar1 = pArray[best_i];
    pArray[best_i] = pArray[pPerm._4_4_];
    pArray[pPerm._4_4_] = pcVar1;
    iVar2 = piVar4[best_i];
    piVar4[best_i] = piVar4[pPerm._4_4_];
    piVar4[pPerm._4_4_] = iVar2;
    best_i = best_i + 1;
  } while( true );
  iVar2 = Vec_IntEntry(vCounts,piVar4[local_30]);
  iVar3 = Vec_IntEntry(vCounts,piVar4[pPerm._4_4_]);
  if ((iVar2 == iVar3) && (iVar2 = strcmp(pArray[local_30],pArray[pPerm._4_4_]), iVar2 < 0)) {
LAB_00ace910:
    pPerm._4_4_ = local_30;
  }
  goto LAB_00ace87a;
}

Assistant:

static inline void Vec_StrSelectSortCost2( char ** pArray, int nSize, Vec_Int_t * vCounts, Vec_Int_t * vPerm )
{
    int i, j, best_i, * pPerm;
    Vec_IntClear( vPerm );
    for ( i = 0; i < nSize; i++ )
        Vec_IntPush( vPerm, i );
    pPerm = Vec_IntArray( vPerm );
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Vec_IntEntry(vCounts, pPerm[j]) <  Vec_IntEntry(vCounts, pPerm[best_i]) || 
                (Vec_IntEntry(vCounts, pPerm[j]) == Vec_IntEntry(vCounts, pPerm[best_i]) && strcmp(pArray[j], pArray[best_i]) < 0) )
                best_i = j;
        ABC_SWAP( char *, pArray[i], pArray[best_i] );
        ABC_SWAP( int,    pPerm[i],  pPerm[best_i] );
    }
}